

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator--(APInt *this)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint uVar3;
  APInt *pAVar4;
  uint64_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  pAVar4 = this;
  uVar3 = this->BitWidth;
  if ((ulong)uVar3 < 0x41) {
    puVar5 = (uint64_t *)((this->U).VAL - 1);
    (this->U).pVal = puVar5;
  }
  else {
    puVar5 = (this->U).pVal;
    uVar6 = (ulong)uVar3 + 0x3f >> 6;
    uVar2 = *puVar5;
    *puVar5 = *puVar5 - 1;
    if (uVar2 == 0) {
      uVar7 = 1;
      do {
        if (uVar6 == uVar7) break;
        puVar1 = puVar5 + uVar7;
        uVar2 = *puVar1;
        *puVar1 = *puVar1 - 1;
        uVar7 = uVar7 + 1;
      } while (uVar2 == 0);
    }
    this = (APInt *)((this->U).pVal + ((int)uVar6 - 1));
    puVar5 = (uint64_t *)(this->U).VAL;
  }
  (this->U).VAL = (ulong)((long)puVar5 << (-(char)uVar3 & 0x3fU)) >> (-(char)uVar3 & 0x3fU);
  return pAVar4;
}

Assistant:

APInt& APInt::operator--() {
  if (isSingleWord())
    --U.VAL;
  else
    tcDecrement(U.pVal, getNumWords());
  return clearUnusedBits();
}